

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseNode.cpp
# Opt level: O0

bool DefaultComparer<CaseNode_*>::Equals(CaseNode *caseNode1,CaseNode *caseNode2)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  int32 iVar4;
  JITJavascriptString *aLeft;
  JITJavascriptString *aRight;
  undefined4 *puVar5;
  JITJavascriptString *caseVal2_1;
  JITJavascriptString *caseVal1_1;
  int caseVal2;
  int caseVal1;
  CaseNode *caseNode2_local;
  CaseNode *caseNode1_local;
  
  bVar2 = CaseNode::IsUpperBoundIntConst(caseNode1);
  if ((bVar2) && (bVar2 = CaseNode::IsUpperBoundIntConst(caseNode2), bVar2)) {
    iVar3 = CaseNode::GetUpperBoundIntConst(caseNode1);
    iVar4 = CaseNode::GetUpperBoundIntConst(caseNode2);
    caseNode1_local._7_1_ = iVar3 == iVar4;
  }
  else {
    bVar2 = CaseNode::IsUpperBoundStrConst(caseNode1);
    if ((bVar2) && (bVar2 = CaseNode::IsUpperBoundStrConst(caseNode2), bVar2)) {
      aLeft = CaseNode::GetUpperBoundStrConst(caseNode1);
      aRight = CaseNode::GetUpperBoundStrConst(caseNode2);
      caseNode1_local._7_1_ = JITJavascriptString::Equals(aLeft,aRight);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CaseNode.cpp"
                         ,0x29,"(false)",
                         "Should not reach here. CaseNodes should store only string or integer case values"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      caseNode1_local._7_1_ = false;
    }
  }
  return caseNode1_local._7_1_;
}

Assistant:

bool
DefaultComparer<CaseNode *>::Equals(CaseNode * caseNode1, CaseNode* caseNode2)
{
    if(caseNode1->IsUpperBoundIntConst() && caseNode2->IsUpperBoundIntConst())
    {
        int caseVal1 = caseNode1->GetUpperBoundIntConst();
        int caseVal2 = caseNode2->GetUpperBoundIntConst();
        return caseVal1 == caseVal2;
    }
    else if(caseNode1->IsUpperBoundStrConst() && caseNode2->IsUpperBoundStrConst())
    {
        JITJavascriptString * caseVal1 = caseNode1->GetUpperBoundStrConst();
        JITJavascriptString * caseVal2 = caseNode2->GetUpperBoundStrConst();
        return JITJavascriptString::Equals(caseVal1, caseVal2);
    }
    else
    {
        AssertMsg(false, "Should not reach here. CaseNodes should store only string or integer case values");
        return false;
    }
}